

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DeepScanLineInputFile::readPixelSampleCounts
          (DeepScanLineInputFile *this,int scanline1,int scanline2)

{
  Data *pDVar1;
  InputStreamMutex *pIVar2;
  Compressor *pCVar3;
  IStream *pIVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  ulong uVar8;
  uint *puVar9;
  ostream *poVar10;
  ArgExc *pAVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int *piVar15;
  char *pcVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long local_3a0;
  int accumulatedCount;
  char *local_390;
  ulong local_388;
  long local_380;
  char *readPtr;
  long local_370;
  long local_368;
  long local_360;
  long local_358;
  char *local_350;
  long local_348;
  stringstream _iex_throw_s;
  undefined4 uStack_33c;
  ostream local_330 [376];
  Lock lock;
  
  if (this->_data->frameBufferValid == false) {
    pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar11,"readPixelSampleCounts called with no valid frame buffer");
    __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  lock._mutex = &this->_data->_streamData->super_Mutex;
  lock._locked = false;
  std::mutex::lock(lock._mutex);
  lock._locked = true;
  iVar7 = (*this->_data->_streamData->is->_vptr_IStream[5])();
  iVar18 = scanline2;
  iVar14 = scanline1;
  if (scanline2 < scanline1) {
    iVar18 = scanline1;
    iVar14 = scanline2;
  }
  if ((iVar14 < this->_data->minY) || (this->_data->maxY < iVar18)) {
    pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc
              (pAVar11,
               "Tried to read scan line sample counts outside the image file\'s data window.");
    __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  if (scanline2 < scanline1) {
    scanline1 = scanline2;
  }
  lVar17 = (long)scanline1;
  local_368 = (long)iVar18;
  local_390 = "Unexpected part number.";
  do {
    pDVar1 = this->_data;
    if (local_368 < lVar17) {
      pIVar4 = pDVar1->_streamData->is;
      (*pIVar4->_vptr_IStream[6])(pIVar4,CONCAT44(extraout_var,iVar7));
      IlmThread_2_5::Lock::~Lock(&lock);
      return;
    }
    iVar14 = pDVar1->minY;
    uVar8 = (long)(int)lVar17 - (long)iVar14;
    if ((pDVar1->gotSampleCount)._data[uVar8] == true) {
      iVar18 = pDVar1->sampleCountXStride;
      lVar13 = (long)pDVar1->minX;
      pcVar16 = pDVar1->sampleCountSliceBase + lVar13 * iVar18 + pDVar1->sampleCountYStride * lVar17
      ;
      for (; lVar13 <= pDVar1->maxX; lVar13 = lVar13 + 1) {
        *(undefined4 *)pcVar16 =
             *(undefined4 *)
              ((long)(pDVar1->sampleCount)._data +
              lVar13 * 4 +
              (pDVar1->sampleCount)._sizeY * ((long)scanline1 - (long)iVar14) * 4 +
              (long)pDVar1->minX * -4);
        pcVar16 = pcVar16 + iVar18;
      }
    }
    else {
      pIVar2 = pDVar1->_streamData;
      iVar14 = (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                    (long)pDVar1->linesInBuffer);
      local_370 = lVar17;
      (*pIVar2->is->_vptr_IStream[6])
                (pIVar2->is,
                 (pDVar1->lineOffsets).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar14]);
      if (((pDVar1->version & 0x1000) != 0) &&
         ((*pIVar2->is->_vptr_IStream[3])(pIVar2->is,&_iex_throw_s,4),
         __iex_throw_s != pDVar1->partNumber)) {
LAB_00405d65:
        pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar11,local_390);
        __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      (*pIVar2->is->_vptr_IStream[3])(pIVar2->is,&_iex_throw_s,4);
      uVar5 = __iex_throw_s;
      lVar17 = (long)(int)__iex_throw_s;
      if (__iex_throw_s != pDVar1->linesInBuffer * iVar14 + pDVar1->minY) {
        local_390 = "Unexpected data block y coordinate.";
        goto LAB_00405d65;
      }
      iVar18 = __iex_throw_s + pDVar1->linesInBuffer + -1;
      if (pDVar1->maxY < iVar18) {
        iVar18 = pDVar1->maxY;
      }
      (*pIVar2->is->_vptr_IStream[3])(pIVar2->is,&_iex_throw_s,8);
      uVar6 = __iex_throw_s;
      uVar8 = CONCAT44(uStack_33c,__iex_throw_s);
      if ((ulong)(long)pDVar1->maxSampleCountTableSize < uVar8) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar10 = std::operator<<(local_330,"Bad sampleCountTableDataSize read from chunk ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar14);
        poVar10 = std::operator<<(poVar10,": expected ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,pDVar1->maxSampleCountTableSize);
        poVar10 = std::operator<<(poVar10," or less, got ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      (*pIVar2->is->_vptr_IStream[3])(pIVar2->is,&_iex_throw_s,8);
      (*pIVar2->is->_vptr_IStream[3])(pIVar2->is,&_iex_throw_s,8);
      if (uVar8 >> 0x1f != 0) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar10 = std::operator<<(local_330,"This version of the library does not ");
        poVar10 = std::operator<<(poVar10,"support the allocation of data with size  > ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x7fffffff);
        poVar10 = std::operator<<(poVar10," file table size    :");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        std::operator<<(poVar10,".\n");
        pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      local_388 = CONCAT44(uStack_33c,__iex_throw_s);
      (*pIVar2->is->_vptr_IStream[3])(pIVar2->is,(pDVar1->sampleCountTableBuffer)._data,uVar6);
      if (uVar8 < (ulong)(long)pDVar1->maxSampleCountTableSize) {
        pCVar3 = pDVar1->sampleCountTableComp;
        if (pCVar3 == (Compressor *)0x0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
          poVar10 = std::operator<<(local_330,"Deep scanline data corrupt at chunk ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar14);
          std::operator<<(poVar10," (sampleCountTableDataSize error)");
          pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&_iex_throw_s);
          __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        (*pCVar3->_vptr_Compressor[6])
                  (pCVar3,(pDVar1->sampleCountTableBuffer)._data,uVar6,(ulong)uVar5,&readPtr);
      }
      else {
        readPtr = (pDVar1->sampleCountTableBuffer)._data;
      }
      local_380 = (long)pDVar1->sampleCountXStride;
      local_360 = (long)pDVar1->sampleCountYStride;
      local_358 = (long)iVar18;
      pcVar16 = pDVar1->sampleCountSliceBase + lVar17 * local_360;
      local_3a0 = 0;
      while (lVar17 <= local_358) {
        lVar13 = lVar17 - pDVar1->minY;
        puVar9 = (pDVar1->lineSampleCount)._data;
        puVar9[lVar13] = 0;
        lVar19 = (long)pDVar1->minX;
        piVar15 = (int *)(pcVar16 + local_380 * lVar19);
        iVar18 = 0;
        local_350 = pcVar16;
        local_348 = lVar17;
        for (; lVar19 <= pDVar1->maxX; lVar19 = lVar19 + 1) {
          Xdr::read<Imf_2_5::CharPtrIO,char_const*>(&readPtr,&accumulatedCount);
          iVar12 = accumulatedCount - iVar18;
          if (accumulatedCount < iVar18) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
            poVar10 = std::operator<<(local_330,"Deep scanline sampleCount data corrupt at chunk ");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar14);
            std::operator<<(poVar10," (negative sample count detected)");
            pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&_iex_throw_s);
            __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
          }
          *(int *)((long)(pDVar1->sampleCount)._data +
                  lVar19 * 4 + (pDVar1->sampleCount)._sizeY * lVar13 * 4 + (long)pDVar1->minX * -4)
               = iVar12;
          puVar9 = (pDVar1->lineSampleCount)._data;
          puVar9[lVar13] = puVar9[lVar13] + iVar12;
          *piVar15 = iVar12;
          piVar15 = (int *)((long)piVar15 + local_380);
          iVar18 = accumulatedCount;
        }
        local_3a0 = local_3a0 + (ulong)puVar9[lVar13];
        uVar8 = pDVar1->combinedSampleSize * local_3a0;
        if (local_388 <= uVar8 && uVar8 - local_388 != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
          poVar10 = std::operator<<(local_330,"Deep scanline sampleCount data corrupt at chunk ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar14);
          poVar10 = std::operator<<(poVar10,": pixel data only contains ");
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          poVar10 = std::operator<<(poVar10," bytes of data but table references at least ");
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          std::operator<<(poVar10," bytes of sample data");
          pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&_iex_throw_s);
          __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        (pDVar1->gotSampleCount)._data[local_348 - pDVar1->minY] = true;
        pcVar16 = local_350 + local_360;
        lVar17 = local_348 + 1;
      }
      pDVar1 = this->_data;
      iVar18 = iVar14 * pDVar1->linesInBuffer + pDVar1->minY;
      iVar14 = pDVar1->linesInBuffer + iVar18 + -1;
      if (pDVar1->maxY < iVar14) {
        iVar14 = pDVar1->maxY;
      }
      bytesPerDeepLineTable
                (&pDVar1->header,iVar18,iVar14,pDVar1->sampleCountSliceBase,
                 pDVar1->sampleCountXStride,pDVar1->sampleCountYStride,&pDVar1->bytesPerLine);
      pDVar1 = this->_data;
      offsetInLineBufferTable
                (&pDVar1->bytesPerLine,iVar18 - pDVar1->minY,iVar14 - pDVar1->minY,
                 pDVar1->linesInBuffer,&pDVar1->offsetInLineBuffer);
      lVar17 = local_370;
    }
    lVar17 = lVar17 + 1;
    scanline1 = scanline1 + 1;
  } while( true );
}

Assistant:

void
DeepScanLineInputFile::readPixelSampleCounts (int scanline1, int scanline2)
{
    Int64 savedFilePos = 0;

    if(!_data->frameBufferValid)
    {
        throw IEX_NAMESPACE::ArgExc("readPixelSampleCounts called with no valid frame buffer");
    }
    
    try
    {
        Lock lock (*_data->_streamData);

        savedFilePos = _data->_streamData->is->tellg();

        int scanLineMin = min (scanline1, scanline2);
        int scanLineMax = max (scanline1, scanline2);

        if (scanLineMin < _data->minY || scanLineMax > _data->maxY)
            throw IEX_NAMESPACE::ArgExc ("Tried to read scan line sample counts outside "
                               "the image file's data window.");

        for (int i = scanLineMin; i <= scanLineMax; i++)
        {
            //
            // if scanline is already read, it'll be in the cache
            // otherwise, read from file, store in cache and in caller's framebuffer
            //
            if (_data->gotSampleCount[i - _data->minY])
            {
                fillSampleCountFromCache(i,_data);
                                         
            }else{

                int lineBlockId = ( i - _data->minY ) / _data->linesInBuffer;

                readSampleCountForLineBlock ( _data->_streamData, _data, lineBlockId );

                int minYInLineBuffer = lineBlockId * _data->linesInBuffer + _data->minY;
                int maxYInLineBuffer = min ( minYInLineBuffer + _data->linesInBuffer - 1, _data->maxY );

                //
                // For each line within the block, get the count of bytes.
                //

                bytesPerDeepLineTable ( _data->header,
                                        minYInLineBuffer,
                                        maxYInLineBuffer,
                                        _data->sampleCountSliceBase,
                                        _data->sampleCountXStride,
                                        _data->sampleCountYStride,
                                        _data->bytesPerLine );

                //
                // For each scanline within the block, get the offset.
                //

                offsetInLineBufferTable ( _data->bytesPerLine,
                                          minYInLineBuffer - _data->minY,
                                          maxYInLineBuffer - _data->minY,
                                          _data->linesInBuffer,
                                          _data->offsetInLineBuffer );
            }
        }

        _data->_streamData->is->seekg(savedFilePos);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading sample count data from image "
                     "file \"" << fileName() << "\". " << e.what());

        _data->_streamData->is->seekg(savedFilePos);

        throw;
    }
}